

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O2

void __thiscall Http2::Frame::Frame(Frame *this)

{
  long in_FS_OFFSET;
  allocator_type local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->buffer,9,&local_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Frame::Frame()
    : buffer(frameHeaderSize)
{
}